

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

void kwssys::SystemToolsStatic::ReplaceString
               (string *source,char *replace,size_t replaceSize,string *with)

{
  char *__haystack;
  char *pcVar1;
  char *__ptr;
  
  __haystack = (source->_M_dataplus)._M_p;
  pcVar1 = strstr(__haystack,replace);
  if (pcVar1 != (char *)0x0) {
    __ptr = strdup(__haystack);
    pcVar1 = __ptr + ((long)pcVar1 - (long)__haystack);
    source->_M_string_length = 0;
    *__haystack = '\0';
    do {
      *pcVar1 = '\0';
      std::__cxx11::string::append((char *)source);
      std::__cxx11::string::_M_append((char *)source,(ulong)(with->_M_dataplus)._M_p);
      pcVar1 = strstr(pcVar1 + replaceSize,replace);
    } while (pcVar1 != (char *)0x0);
    std::__cxx11::string::append((char *)source);
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void SystemToolsStatic::ReplaceString(std::string& source, const char* replace,
                                      size_t replaceSize,
                                      const std::string& with)
{
  const char* src = source.c_str();
  char* searchPos = const_cast<char*>(strstr(src, replace));

  // get out quick if string is not found
  if (!searchPos) {
    return;
  }

  // perform replacements until done
  char* orig = strdup(src);
  char* currentPos = orig;
  searchPos = searchPos - src + orig;

  // initialize the result
  source.erase(source.begin(), source.end());
  do {
    *searchPos = '\0';
    source += currentPos;
    currentPos = searchPos + replaceSize;
    // replace
    source += with;
    searchPos = strstr(currentPos, replace);
  } while (searchPos);

  // copy any trailing text
  source += currentPos;
  free(orig);
}